

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cpp
# Opt level: O1

string * __thiscall
spvtools::GetExtensionString_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,spv_parsed_instruction_t *inst)

{
  if (*(short *)(this + 10) == 10) {
    if (*(short *)(this + 0x20) != 1) {
      __assert_fail("inst->num_operands == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/extensions.cpp"
                    ,0x1f,
                    "std::string spvtools::GetExtensionString(const spv_parsed_instruction_t *)");
    }
    if (*(int *)(*(ushort **)(this + 0x18) + 2) != 0xb) {
      __assert_fail("operand.type == SPV_OPERAND_TYPE_LITERAL_STRING",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/extensions.cpp"
                    ,0x22,
                    "std::string spvtools::GetExtensionString(const spv_parsed_instruction_t *)");
    }
    if (*(ushort *)(this + 8) <= **(ushort **)(this + 0x18)) {
      __assert_fail("inst->num_words > operand.offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/extensions.cpp"
                    ,0x23,
                    "std::string spvtools::GetExtensionString(const spv_parsed_instruction_t *)");
    }
    spvDecodeLiteralStringOperand_abi_cxx11_
              (__return_storage_ptr__,(spv_parsed_instruction_t *)this,0);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"ERROR_not_op_extension","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetExtensionString(const spv_parsed_instruction_t* inst) {
  if (inst->opcode != static_cast<uint16_t>(spv::Op::OpExtension)) {
    return "ERROR_not_op_extension";
  }

  assert(inst->num_operands == 1);

  const auto& operand = inst->operands[0];
  assert(operand.type == SPV_OPERAND_TYPE_LITERAL_STRING);
  assert(inst->num_words > operand.offset);
  (void)operand; /* No unused variables in release builds. */

  return spvDecodeLiteralStringOperand(*inst, 0);
}